

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall QString::clear(QString *this)

{
  QArrayData *pQVar1;
  
  if ((this->d).ptr != (char16_t *)0x0) {
    pQVar1 = &((this->d).d)->super_QArrayData;
    (this->d).d = (Data *)0x0;
    (this->d).ptr = (char16_t *)0x0;
    (this->d).size = 0;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr bool isNull() const noexcept
    {
        return !ptr;
    }